

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

UploadSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
          *samples,bool logBucketPerformance)

{
  pointer pUVar1;
  pointer pUVar2;
  float fVar3;
  float fVar4;
  ulong uVar5;
  SampleBuilder *pSVar6;
  ulong uVar7;
  offset_in_SampleType_to_deUint64 in_RCX;
  deUint64 *pdVar8;
  int *piVar9;
  string *psVar10;
  LogNumber<float> *pLVar11;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  void *__buf_17;
  void *__buf_18;
  void *__buf_19;
  void *__buf_20;
  void *__buf_21;
  void *__buf_22;
  void *__buf_23;
  void *__buf_24;
  void *__buf_25;
  void *__buf_26;
  void *__buf_27;
  long lVar12;
  long lVar13;
  int __fd;
  ulong uVar14;
  ulong in_R9;
  uint uVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float xmin;
  float fVar19;
  float xmin_00;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float xmax;
  float xmax_00;
  float fVar24;
  float fVar25;
  float fVar26;
  UploadSampleAnalyzeResult UVar27;
  allocator<char> local_aee;
  allocator<char> local_aed;
  allocator<char> local_aec;
  allocator<char> local_aeb;
  allocator<char> local_aea;
  allocator<char> local_ae9;
  float local_ae8;
  allocator<char> local_ae2;
  allocator<char> local_ae1;
  allocator<char> local_ae0;
  allocator<char> local_adf;
  allocator<char> local_ade;
  allocator<char> local_add;
  allocator<char> local_adc;
  allocator<char> local_adb;
  allocator<char> local_ada;
  allocator<char> local_ad9;
  allocator<char> local_ad8;
  allocator<char> local_ad7;
  allocator<char> local_ad6;
  allocator<char> local_ad5;
  allocator<char> local_ad4;
  allocator<char> local_ad3;
  allocator<char> local_ad2;
  allocator<char> local_ad1;
  allocator<char> local_ad0;
  allocator<char> local_acf;
  allocator<char> local_ace;
  allocator<char> local_acd;
  allocator<char> local_acc;
  allocator<char> local_acb;
  allocator<char> local_aca;
  allocator<char> local_ac9;
  allocator<char> local_ac8;
  allocator<char> local_ac7;
  allocator<char> local_ac6;
  allocator<char> local_ac5;
  LineParametersWithConfidence theilSenFitting;
  LineParametersWithConfidence contributionFitting;
  vector<float,_std::allocator<float>_> processingRates;
  ScopedLogSection section_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  string local_978;
  string local_958;
  string local_938;
  string local_918;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  string local_878;
  ScopedLogSection section_1;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  LogNumber<float> local_728;
  LogNumber<float> local_6c0;
  ScopedLogSection section;
  LogNumber<float> local_638;
  LogNumber<float> local_5d0;
  LogNumber<float> local_568;
  LogNumber<float> local_500;
  LogNumber<float> local_498;
  LogNumber<float> local_430;
  LogNumber<float> local_3c8;
  LogNumber<float> local_360;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  StatsType resultStats;
  
  (anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>>
            (&theilSenFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
              *)0x20,in_RCX);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&values,((long)(samples->
                            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(samples->
                           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 0x38,
             (allocator_type *)&processingRates);
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) / 0x38;
  uVar14 = 0;
  uVar7 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    uVar7 = uVar14;
  }
  pdVar8 = &(pUVar1->duration).fitResponseDuration;
  for (; uVar7 != uVar14; uVar14 = uVar14 + 1) {
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar14] = *pdVar8;
    pdVar8 = pdVar8 + 7;
  }
  std::vector<float,_std::allocator<float>_>::vector
            (&processingRates,uVar5,(allocator_type *)&local_728);
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) / 0x38;
  uVar14 = 0;
  uVar7 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    uVar7 = uVar14;
  }
  piVar9 = &pUVar1->writtenSize;
  for (; uVar7 != uVar14; uVar14 = uVar14 + 1) {
    uVar5 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar14];
    if ((long)uVar5 < 0) {
      in_R9 = uVar5 >> 1;
    }
    *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + uVar14 * 4) =
         (float)*piVar9 / (((float)uVar5 / 1000.0) / 1000.0);
    piVar9 = piVar9 + 0xe;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_),
             CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_));
  resultStats.medianRate =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.5);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&processingRates.super__Vector_base<float,_std::allocator<float>_>);
  std::vector<float,_std::allocator<float>_>::vector
            (&processingRates,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x38,(allocator_type *)&local_728);
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) / 0x38;
  uVar14 = 0;
  uVar7 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    uVar7 = uVar14;
  }
  piVar9 = &pUVar1->writtenSize;
  for (; uVar7 != uVar14; uVar14 = uVar14 + 1) {
    uVar5 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar14];
    if ((long)uVar5 < 0) {
      in_R9 = uVar5 >> 1;
    }
    *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + uVar14 * 4) =
         (float)uVar5 - ((float)*piVar9 * theilSenFitting.coefficient + theilSenFitting.offset);
    piVar9 = piVar9 + 0xe;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_),
             CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_));
  resultStats.maxDiffTime =
       *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._4_4_,
                           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._0_4_) + -4);
  resultStats.maxDiff9DecileTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.9);
  resultStats.medianDiffTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.5);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&processingRates.super__Vector_base<float,_std::allocator<float>_>);
  std::vector<float,_std::allocator<float>_>::vector
            (&processingRates,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x38,(allocator_type *)&local_728);
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) / 0x38;
  uVar14 = 0;
  uVar7 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    uVar7 = uVar14;
  }
  piVar9 = &pUVar1->writtenSize;
  for (; uVar7 != uVar14; uVar14 = uVar14 + 1) {
    fVar17 = (float)*piVar9 * theilSenFitting.coefficient + theilSenFitting.offset;
    fVar22 = 0.0;
    if (1.0 <= fVar17) {
      uVar5 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14];
      if ((long)uVar5 < 0) {
        in_R9 = uVar5 >> 1;
      }
      fVar22 = ((float)uVar5 - fVar17) / fVar17;
    }
    *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + uVar14 * 4) = fVar22;
    piVar9 = piVar9 + 0xe;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_),
             CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_));
  resultStats.maxRelDiffTime =
       *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._4_4_,
                           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._0_4_) + -4);
  resultStats.max9DecileRelDiffTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.9);
  resultStats.medianRelDiffTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.5);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&processingRates.super__Vector_base<float,_std::allocator<float>_>);
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
  uVar7 = *values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = uVar7;
  if ((long)uVar7 < 0) {
    uVar5 = (ulong)((uint)uVar7 & 1) | uVar7 >> 1;
  }
  resultStats.result.minTime = (float)uVar7;
  uVar7 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  if ((long)uVar7 < 0) {
    uVar5 = uVar7 >> 1;
  }
  resultStats.result.maxTime = (float)uVar7;
  resultStats.result.medianTime =
       linearSample<unsigned_long>
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.5);
  resultStats.result.min2DecileTime =
       linearSample<unsigned_long>
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.1);
  resultStats.result.max9DecileTime =
       linearSample<unsigned_long>
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.9);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  (anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>>
            (&resultStats.map,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
              *)0x0,uVar5);
  (anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>>
            (&resultStats.unmap,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
              *)0x8,uVar5);
  (anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>>
            (&resultStats.write,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
              *)0x10,uVar5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values,"Samples",(allocator<char> *)&local_728);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&processingRates,"Samples",(allocator<char> *)&local_6c0);
  psVar10 = (string *)&processingRates;
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&values,psVar10);
  std::__cxx11::string::~string((string *)&processingRates);
  std::__cxx11::string::~string((string *)&values);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_500,"Samples",(allocator<char> *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"Samples",(allocator<char> *)&local_138);
  tcu::LogSampleList::LogSampleList((LogSampleList *)&local_498,&local_500.m_name,&local_568.m_name)
  ;
  __fd = (int)log;
  tcu::LogSampleList::write((LogSampleList *)&local_498,__fd,__buf,(size_t)psVar10);
  tcu::TestLog::startSampleInfo(log);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,"WrittenSize",(allocator<char> *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_638,"Written size",(allocator<char> *)&local_178);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contributionFitting,"bytes",(allocator<char> *)&local_198);
  psVar10 = (string *)&contributionFitting;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&values,&local_5d0.m_name,&local_638.m_name,psVar10,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::LogValueInfo::write((LogValueInfo *)&values,__fd,__buf_00,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section_1,"BufferSize",(allocator<char> *)&local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_878,"Buffer size",(allocator<char> *)&local_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_898,"bytes",(allocator<char> *)&local_1f8);
  psVar10 = &local_898;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&processingRates,(string *)&section_1,&local_878,psVar10,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::LogValueInfo::write((LogValueInfo *)&processingRates,__fd,__buf_01,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b8,"TotalTime",(allocator<char> *)&local_218);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8d8,"Total time",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f8,"us",(allocator<char> *)&local_258);
  psVar10 = &local_8f8;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_728,&local_8b8,&local_8d8,psVar10,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_728,__fd,__buf_02,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_918,"MapTime",(allocator<char> *)&local_278);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_938,"Map time",(allocator<char> *)&local_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_958,"us",(allocator<char> *)&local_2b8);
  psVar10 = &local_958;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_6c0,&local_918,&local_938,psVar10,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_6c0,__fd,__buf_03,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_978,"UnmapTime",(allocator<char> *)&local_2d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_748,"Unmap time",(allocator<char> *)&local_2f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_768,"us",(allocator<char> *)&section_2);
  psVar10 = &local_768;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_360,&local_978,&local_748,psVar10,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_360,__fd,__buf_04,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_788,"WriteTime",&local_ae9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a8,"Write time",&local_aea);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c8,"us",&local_aeb);
  psVar10 = &local_7c8;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_3c8,&local_788,&local_7a8,psVar10,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_3c8,__fd,__buf_05,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e8,"FitResidual",&local_aec);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_808,"Fit residual",&local_aed)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_828,"us",&local_aee);
  psVar10 = &local_828;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_430,&local_7e8,&local_808,psVar10,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_430,__fd,__buf_06,(size_t)psVar10);
  tcu::TestLog::endSampleInfo(log);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_430);
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::~string((string *)&local_808);
  std::__cxx11::string::~string((string *)&local_7e8);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_788);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_360);
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_978);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_6c0);
  std::__cxx11::string::~string((string *)&local_958);
  std::__cxx11::string::~string((string *)&local_938);
  std::__cxx11::string::~string((string *)&local_918);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_728);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string((string *)&local_8b8);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&processingRates);
  std::__cxx11::string::~string((string *)&local_898);
  std::__cxx11::string::~string((string *)&local_878);
  std::__cxx11::string::~string((string *)&section_1);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&values);
  std::__cxx11::string::~string((string *)&contributionFitting);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_5d0);
  tcu::LogSampleList::~LogSampleList((LogSampleList *)&local_498);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_500);
  lVar13 = 0;
  for (lVar12 = 0;
      pUVar1 = (samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      lVar12 < (int)(((long)(samples->
                            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) / 0x38);
      lVar12 = lVar12 + 1) {
    local_ae8 = (float)*(ulong *)((long)&(pUVar1->duration).fitResponseDuration + lVar13);
    fVar17 = (float)*(int *)((long)&pUVar1->writtenSize + lVar13) * theilSenFitting.coefficient +
             theilSenFitting.offset;
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._8_16_ = ZEXT416(0);
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)log;
    pSVar6 = tcu::SampleBuilder::operator<<
                       ((SampleBuilder *)&values,*(int *)((long)&pUVar1->writtenSize + lVar13));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&((samples->
                                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->
                                               bufferSize + lVar13));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).totalDuration + lVar13));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).mapDuration + lVar13));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).unmapDuration + lVar13));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).writeDuration + lVar13));
    pSVar6 = tcu::SampleBuilder::operator<<(pSVar6,local_ae8 - fVar17);
    tcu::SampleBuilder::operator<<(pSVar6,(EndSampleToken *)&tcu::TestLog::EndSample);
    std::_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::
    ~_Vector_base((_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>
                   *)&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    lVar13 = lVar13 + 0x38;
  }
  tcu::TestLog::endSampleList(log);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values,"Contribution",(allocator<char> *)&local_728);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&processingRates,"Contributions",(allocator<char> *)&local_6c0);
  psVar10 = (string *)&processingRates;
  tcu::ScopedLogSection::ScopedLogSection(&section_1,log,(string *)&values,psVar10);
  std::__cxx11::string::~string((string *)&processingRates);
  std::__cxx11::string::~string((string *)&values);
  (anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
              *)0x0,(offset_in_SampleType_to_deUint64)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c0,"MapConstantCost",(allocator<char> *)&local_878);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"Map: Approximated contant cost",(allocator<char> *)&local_898);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"us",(allocator<char> *)&local_8b8);
  pLVar11 = &local_3c8;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_6c0.m_name,&local_360.m_name,&pLVar11->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_07,(size_t)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"MapLinearCost",(allocator<char> *)&local_8d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"Map: Approximated linear cost",(allocator<char> *)&local_8f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_500,"us / MB",(allocator<char> *)&local_918);
  pLVar11 = &local_500;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_430.m_name,&local_498.m_name,
             &pLVar11->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_08,(size_t)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"MapMedianCost",(allocator<char> *)&local_938);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,"Map: Median cost",(allocator<char> *)&local_958);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_638,"us",(allocator<char> *)&local_978);
  pLVar11 = &local_638;
  tcu::LogNumber<float>::LogNumber
            (&local_728,&local_568.m_name,&local_5d0.m_name,&pLVar11->m_name,QP_KEY_TAG_TIME,
             resultStats.map.medianTime);
  tcu::LogNumber<float>::write(&local_728,__fd,__buf_09,(size_t)pLVar11);
  tcu::LogNumber<float>::~LogNumber(&local_728);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_568);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_430);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_6c0);
  (anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
              *)0x8,(offset_in_SampleType_to_deUint64)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c0,"UnmapConstantCost",(allocator<char> *)&local_878);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"Unmap: Approximated contant cost",(allocator<char> *)&local_898);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"us",(allocator<char> *)&local_8b8);
  pLVar11 = &local_3c8;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_6c0.m_name,&local_360.m_name,&pLVar11->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_10,(size_t)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"UnmapLinearCost",(allocator<char> *)&local_8d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"Unmap: Approximated linear cost",(allocator<char> *)&local_8f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_500,"us / MB",(allocator<char> *)&local_918);
  pLVar11 = &local_500;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_430.m_name,&local_498.m_name,
             &pLVar11->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_11,(size_t)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"UnmapMedianCost",(allocator<char> *)&local_938);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,"Unmap: Median cost",(allocator<char> *)&local_958);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_638,"us",(allocator<char> *)&local_978);
  pLVar11 = &local_638;
  tcu::LogNumber<float>::LogNumber
            (&local_728,&local_568.m_name,&local_5d0.m_name,&pLVar11->m_name,QP_KEY_TAG_TIME,
             resultStats.unmap.medianTime);
  tcu::LogNumber<float>::write(&local_728,__fd,__buf_12,(size_t)pLVar11);
  tcu::LogNumber<float>::~LogNumber(&local_728);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_568);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_430);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_6c0);
  (anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
              *)0x10,(offset_in_SampleType_to_deUint64)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c0,"WriteConstantCost",(allocator<char> *)&local_878);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"Write: Approximated contant cost",(allocator<char> *)&local_898);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"us",(allocator<char> *)&local_8b8);
  pLVar11 = &local_3c8;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_6c0.m_name,&local_360.m_name,&pLVar11->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_13,(size_t)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"WriteLinearCost",(allocator<char> *)&local_8d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"Write: Approximated linear cost",(allocator<char> *)&local_8f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_500,"us / MB",(allocator<char> *)&local_918);
  pLVar11 = &local_500;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_430.m_name,&local_498.m_name,
             &pLVar11->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_14,(size_t)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"WriteMedianCost",(allocator<char> *)&local_938);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,"Write: Median cost",(allocator<char> *)&local_958);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_638,"us",(allocator<char> *)&local_978);
  pLVar11 = &local_638;
  tcu::LogNumber<float>::LogNumber
            (&local_728,&local_568.m_name,&local_5d0.m_name,&pLVar11->m_name,QP_KEY_TAG_TIME,
             resultStats.write.medianTime);
  tcu::LogNumber<float>::write(&local_728,__fd,__buf_15,(size_t)pLVar11);
  tcu::LogNumber<float>::~LogNumber(&local_728);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_568);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_430);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_6c0);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values,"Results",(allocator<char> *)&local_728);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&processingRates,"Results",(allocator<char> *)&local_6c0);
  tcu::ScopedLogSection::ScopedLogSection
            (&section_2,log,(string *)&values,(string *)&processingRates);
  std::__cxx11::string::~string((string *)&processingRates);
  std::__cxx11::string::~string((string *)&values);
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pUVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_ae8 = (float)((pUVar2[-1].bufferSize + pUVar1->bufferSize) / 2);
  fVar23 = theilSenFitting.coefficient * local_ae8;
  fVar18 = theilSenFitting.offset + fVar23;
  uVar7 = ((long)pUVar2 - (long)pUVar1) / 0x38;
  uVar7 = (long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) / 2;
  (anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>>
            ((LineParametersWithConfidence *)&values,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
              *)0x0,(int)uVar7,0x20,in_R9);
  (anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>>
            ((LineParametersWithConfidence *)&processingRates,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
              *)(uVar7 & 0xffffffff),
             (int)(((long)(samples->
                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(samples->
                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x38),0x20,in_R9);
  fVar22 = processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish._4_4_;
  fVar17 = processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pUVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  xmin = (float)pUVar1->writtenSize;
  fVar25 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  fVar3 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_;
  xmax = (float)pUVar2[-1].writtenSize;
  fVar19 = getAreaBetweenLines(xmin,xmax,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            ((LineParametersWithConfidence *)&values,samples,0,
             (int)(((long)pUVar2 - (long)pUVar1) / 0x38),2,0x20);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            ((LineParametersWithConfidence *)&processingRates,samples,1,
             (int)(((long)(samples->
                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(samples->
                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x38),2,0x20);
  xmin_00 = (float)((samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                    )._M_impl.super__Vector_impl_data._M_start)->writtenSize;
  fVar26 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  fVar4 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_;
  xmax_00 = (float)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish[-1].writtenSize;
  fVar20 = getAreaBetweenLines(xmin_00,xmax_00,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contributionFitting,"ResultLinearity",&local_ae9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section_1,"Sample linearity",&local_aea);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_878,"%",&local_aeb);
  fVar21 = fVar3 * xmin + fVar25;
  fVar24 = fVar22 * xmin + fVar17;
  uVar15 = -(uint)(fVar21 <= fVar24);
  fVar25 = fVar3 * xmax + fVar25;
  fVar17 = fVar22 * xmax + fVar17;
  uVar16 = -(uint)(fVar17 <= fVar25);
  fVar17 = ((float)(~uVar16 & (uint)fVar17 | (uint)fVar25 & uVar16) -
           (float)(~uVar15 & (uint)fVar24 | (uint)fVar21 & uVar15)) * (xmax - xmin);
  fVar22 = (float)(~-(uint)(fVar17 < 1e-06) & (uint)(1.0 - fVar19 / fVar17));
  fVar17 = 1.0;
  if (fVar22 <= 1.0) {
    fVar17 = fVar22;
  }
  psVar10 = &local_878;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,(string *)&contributionFitting,(string *)&section_1,psVar10
             ,QP_KEY_TAG_QUALITY,(float)(~-(uint)(fVar22 < 0.0) & (uint)(fVar17 * 100.0)));
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_16,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_898,"SampleTemporalStability",&local_aec);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b8,"Sample temporal stability",&local_aed);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,"%",&local_aee);
  fVar17 = fVar4 * xmin_00 + fVar26;
  fVar22 = processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish._4_4_ * xmin_00 +
           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  uVar15 = -(uint)(fVar17 <= fVar22);
  fVar26 = fVar4 * xmax_00 + fVar26;
  fVar25 = processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish._4_4_ * xmax_00 +
           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  uVar16 = -(uint)(fVar25 <= fVar26);
  fVar17 = ((float)(~uVar16 & (uint)fVar25 | (uint)fVar26 & uVar16) -
           (float)(~uVar15 & (uint)fVar22 | (uint)fVar17 & uVar15)) * (xmax_00 - xmin_00);
  fVar22 = (float)(~-(uint)(fVar17 < 1e-06) & (uint)(1.0 - fVar20 / fVar17));
  fVar17 = 1.0;
  if (fVar22 <= 1.0) {
    fVar17 = fVar22;
  }
  psVar10 = &local_8d8;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_898,&local_8b8,psVar10,QP_KEY_TAG_QUALITY,
             (float)(~-(uint)(fVar22 < 0.0) & (uint)(fVar17 * 100.0)));
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_17,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f8,"ApproximatedConstantCost",&local_ac5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_918,"Approximated contant cost",&local_ac6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_938,"us",&local_ac7);
  psVar10 = &local_938;
  tcu::LogNumber<float>::LogNumber
            (&local_728,&local_8f8,&local_918,psVar10,QP_KEY_TAG_TIME,theilSenFitting.offset);
  tcu::LogNumber<float>::write(&local_728,__fd,__buf_18,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_958,"ApproximatedConstantCostConfidence60Lower",&local_ac8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_978,"Approximated contant cost 60% confidence lower limit",&local_ac9)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_748,"us",&local_aca);
  psVar10 = &local_748;
  tcu::LogNumber<float>::LogNumber
            (&local_6c0,&local_958,&local_978,psVar10,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceLower);
  tcu::LogNumber<float>::write(&local_6c0,__fd,__buf_19,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_768,"ApproximatedConstantCostConfidence60Upper",&local_acb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_788,"Approximated contant cost 60% confidence upper limit",&local_acc)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a8,"us",&local_acd);
  psVar10 = &local_7a8;
  tcu::LogNumber<float>::LogNumber
            (&local_360,&local_768,&local_788,psVar10,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceUpper);
  tcu::LogNumber<float>::write(&local_360,__fd,__buf_20,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c8,"ApproximatedLinearCost",&local_ace);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"Approximated linear cost",&local_acf);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_808,"us / MB",&local_ad0);
  psVar10 = &local_808;
  tcu::LogNumber<float>::LogNumber
            (&local_3c8,&local_7c8,&local_7e8,psVar10,QP_KEY_TAG_TIME,
             theilSenFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write(&local_3c8,__fd,__buf_21,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_828,"ApproximatedLinearCostConfidence60Lower",&local_ad1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section,"Approximated linear cost 60% confidence lower limit",&local_ad2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"us / MB",&local_ad3);
  psVar10 = &local_118;
  tcu::LogNumber<float>::LogNumber
            (&local_430,&local_828,(string *)&section,psVar10,QP_KEY_TAG_TIME,
             theilSenFitting.coefficientConfidenceLower * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write(&local_430,__fd,__buf_22,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"ApproximatedLinearCostConfidence60Upper",&local_ad4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"Approximated linear cost 60% confidence upper limit",&local_ad5);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"us / MB",&local_ad6);
  psVar10 = &local_178;
  tcu::LogNumber<float>::LogNumber
            (&local_498,&local_138,&local_158,psVar10,QP_KEY_TAG_TIME,
             theilSenFitting.coefficientConfidenceUpper * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write(&local_498,__fd,__buf_23,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"ApproximatedTransferRate",&local_ad7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Approximated transfer rate",&local_ad8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"MB / s",&local_ad9);
  fVar17 = local_ae8 / ((fVar18 / 1000.0) / 1000.0);
  psVar10 = &local_1d8;
  tcu::LogNumber<float>::LogNumber
            (&local_500,&local_198,&local_1b8,psVar10,QP_KEY_TAG_PERFORMANCE,
             fVar17 * 0.0009765625 * 0.0009765625);
  tcu::LogNumber<float>::write(&local_500,__fd,__buf_24,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"ApproximatedTransferRateNoConstant",&local_ada);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"Approximated transfer rate without constant cost",&local_adb);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"MB / s",&local_adc);
  psVar10 = &local_238;
  tcu::LogNumber<float>::LogNumber
            (&local_568,&local_1f8,&local_218,psVar10,QP_KEY_TAG_PERFORMANCE,
             (local_ae8 / ((fVar23 / 1000.0) / 1000.0)) * 0.0009765625 * 0.0009765625);
  tcu::LogNumber<float>::write(&local_568,__fd,__buf_25,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"SampleMedianTime",&local_add);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"Median sample time",&local_ade);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"us",&local_adf);
  psVar10 = &local_298;
  tcu::LogNumber<float>::LogNumber
            (&local_5d0,&local_258,&local_278,psVar10,QP_KEY_TAG_TIME,resultStats.result.medianTime)
  ;
  tcu::LogNumber<float>::write(&local_5d0,__fd,__buf_26,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"SampleMedianTransfer",&local_ae0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"Median transfer rate",&local_ae1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"MB / s",&local_ae2);
  psVar10 = &local_2f8;
  tcu::LogNumber<float>::LogNumber
            (&local_638,&local_2b8,&local_2d8,psVar10,QP_KEY_TAG_PERFORMANCE,
             resultStats.medianRate * 0.0009765625 * 0.0009765625);
  tcu::LogNumber<float>::write(&local_638,__fd,__buf_27,(size_t)psVar10);
  tcu::LogNumber<float>::~LogNumber(&local_638);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  tcu::LogNumber<float>::~LogNumber(&local_5d0);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  tcu::LogNumber<float>::~LogNumber(&local_568);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  tcu::LogNumber<float>::~LogNumber(&local_500);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  tcu::LogNumber<float>::~LogNumber(&local_498);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  tcu::LogNumber<float>::~LogNumber(&local_430);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_828);
  tcu::LogNumber<float>::~LogNumber(&local_3c8);
  std::__cxx11::string::~string((string *)&local_808);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::~string((string *)&local_7c8);
  tcu::LogNumber<float>::~LogNumber(&local_360);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_768);
  tcu::LogNumber<float>::~LogNumber(&local_6c0);
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_978);
  std::__cxx11::string::~string((string *)&local_958);
  tcu::LogNumber<float>::~LogNumber(&local_728);
  std::__cxx11::string::~string((string *)&local_938);
  std::__cxx11::string::~string((string *)&local_918);
  std::__cxx11::string::~string((string *)&local_8f8);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::__cxx11::string::~string((string *)&local_898);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_878);
  std::__cxx11::string::~string((string *)&section_1);
  std::__cxx11::string::~string((string *)&contributionFitting);
  tcu::ScopedLogSection::~ScopedLogSection(&section_2);
  UVar27.transferRateAtRange = fVar17;
  UVar27.transferRateMedian = resultStats.medianRate;
  UVar27.transferRateAtInfinity = resultStats.medianRate;
  return UVar27;
}

Assistant:

static UploadSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<UploadSampleResult<SampleType> >& samples, bool logBucketPerformance)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedTransferRate;
	float													approximatedTransferRateNoConstant;

	// Output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Calculate results for different ranges
	if (logBucketPerformance)
	{
		const int										numBuckets				= 4;
		int												minBufferSize			= 0;
		int												maxBufferSize			= 0;
		std::vector<UploadSampleResult<SampleType> >	buckets[numBuckets];

		bucketizeSamplesUniformly(samples, &buckets[0], numBuckets, minBufferSize, maxBufferSize);

		for (int bucketNdx = 0; bucketNdx < numBuckets; ++bucketNdx)
		{
			if (buckets[bucketNdx].empty())
				continue;

			// Print a nice result summary

			const int												bucketRangeMin	= minBufferSize + (int)(((float) bucketNdx    / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const int												bucketRangeMax	= minBufferSize + (int)(((float)(bucketNdx+1) / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const typename SampleTypeTraits<SampleType>::StatsType	stats			= calculateSampleStatistics(theilSenFitting, buckets[bucketNdx]);
			const tcu::ScopedLogSection								section			(log, "BufferSizeRange", std::string("Transfer performance with buffer size in range [").append(getHumanReadableByteSize(bucketRangeMin).append(", ").append(getHumanReadableByteSize(bucketRangeMax).append("]"))));

			logMapRangeStats<SampleType>(log, stats);
			logUnmapStats<SampleType>(log, stats);
			logWriteStats<SampleType>(log, stats);
			logFlushStats<SampleType>(log, stats);
			logAllocStats<SampleType>(log, stats);

			log	<< tcu::TestLog::Float("Min", "Total: Min time", "us", QP_KEY_TAG_TIME, stats.result.minTime)
				<< tcu::TestLog::Float("Max", "Total: Max time", "us", QP_KEY_TAG_TIME, stats.result.maxTime)
				<< tcu::TestLog::Float("Min90", "Total: 90%-Min time", "us", QP_KEY_TAG_TIME, stats.result.min2DecileTime)
				<< tcu::TestLog::Float("Max90", "Total: 90%-Max time", "us", QP_KEY_TAG_TIME, stats.result.max9DecileTime)
				<< tcu::TestLog::Float("Median", "Total: Median time", "us", QP_KEY_TAG_TIME, stats.result.medianTime)
				<< tcu::TestLog::Float("MedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, stats.medianRate / 1024.0f / 1024.0f)
				<< tcu::TestLog::Float("MaxDiff", "Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiffTime)
				<< tcu::TestLog::Float("Max90Diff", "90%-Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiff9DecileTime)
				<< tcu::TestLog::Float("MedianDiff", "Median difference to approximated", "us", QP_KEY_TAG_TIME, stats.medianDiffTime)
				<< tcu::TestLog::Float("MaxRelDiff", "Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.maxRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("Max90RelDiff", "90%-Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.max9DecileRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("MedianRelDiff", "Median relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.medianRelDiffTime * 100.0f);
		}
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logMapContribution(log, samples, resultStats);
		logUnmapContribution(log, samples, resultStats);
		logWriteContribution(log, samples, resultStats);
		logFlushContribution(log, samples, resultStats);
		logAllocContribution(log, samples, resultStats);
	}

	// Print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianBufferSize					= (samples.front().bufferSize + samples.back().bufferSize) / 2;
		const float	approximatedTransferTime			= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	approximatedTransferTimeNoConstant	= (theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedTransferRateNoConstant				= (float)medianBufferSize / approximatedTransferTimeNoConstant;
		approximatedTransferRate						= (float)medianBufferSize / approximatedTransferTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRate", "Approximated transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRateNoConstant", "Approximated transfer rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated transfer rate
	{
		UploadSampleAnalyzeResult result;

		result.transferRateMedian = resultStats.medianRate;
		result.transferRateAtRange = approximatedTransferRate;
		result.transferRateAtInfinity = approximatedTransferRateNoConstant;

		return result;
	}
}